

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::ret<(SM83::Conditions)1>(SM83 *this)

{
  u64 cycles;
  string_view fmt;
  format_args args;
  ulong local_78 [2];
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  char *local_18;
  undefined8 local_10;
  
  local_78[0] = (ulong)(this->field_0).af;
  local_68 = (ulong)(this->field_1).bc;
  local_58 = (ulong)(this->field_2).de;
  local_48 = (ulong)(this->field_3).hl;
  local_38 = (ulong)this->sp;
  local_28 = (ulong)this->pc_at_opcode;
  local_18 = "C";
  local_10 = 1;
  fmt.size_ = 0x44;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RET {}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_78;
  args.desc_ = 0xd222222;
  ::fmt::v11::vprint(fmt,args);
  cycles = 4;
  if (((this->field_0).field_1.f & 0x10) != 0) {
    StackPop(this,&this->pc);
    cycles = 8;
  }
  Timer::AdvanceCycles(this->timer,cycles);
  return;
}

Assistant:

void SM83::ret() {
    if constexpr (cond == Conditions::None) {
        LTRACE("RET");
        
        StackPop(&pc);
        timer.AdvanceCycles(4);
    } else {
        LTRACE("RET {}", GetConditionString<cond>());

        if (MeetsCondition<cond>()) {
            StackPop(&pc);
            timer.AdvanceCycles(8);
        } else {
            timer.AdvanceCycles(4);
        }
    }
}